

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Panel.cpp
# Opt level: O2

shared_ptr<gui::PanelStyle> __thiscall gui::Panel::getStyle(Panel *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<gui::PanelStyle> sVar1;
  
  if (*(char *)(in_RSI + 0x210) == '\0') {
    std::make_shared<gui::PanelStyle,gui::PanelStyle_const&>((PanelStyle *)&stack0xffffffffffffffd0)
    ;
    std::__shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x200),
               (__shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
    *(undefined1 *)(in_RSI + 0x210) = 1;
  }
  std::__shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x200));
  sVar1.super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<gui::PanelStyle>)
         sVar1.super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<PanelStyle> Panel::getStyle() {
    if (!styleCopied_) {
        style_ = style_->clone();
        styleCopied_ = true;
    }
    return style_;
}